

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_normalize_jac_many(mbedtls_ecp_group *grp,mbedtls_ecp_point **T,size_t T_size)

{
  mbedtls_mpi *X;
  undefined1 local_88 [8];
  mbedtls_mpi ZZi;
  mbedtls_mpi Zi;
  mbedtls_mpi u;
  mbedtls_mpi *c;
  size_t i;
  int ret;
  size_t T_size_local;
  mbedtls_ecp_point **T_local;
  mbedtls_ecp_group *grp_local;
  
  if (T_size < 2) {
    grp_local._4_4_ = ecp_normalize_jac(grp,*T);
  }
  else {
    X = (mbedtls_mpi *)calloc(T_size,0x18);
    if (X == (mbedtls_mpi *)0x0) {
      grp_local._4_4_ = -0x4d80;
    }
    else {
      for (c = (mbedtls_mpi *)0x0; c < T_size; c = (mbedtls_mpi *)((long)&c->s + 1)) {
        mbedtls_mpi_init(X + (long)c);
      }
      mbedtls_mpi_init((mbedtls_mpi *)&Zi.p);
      mbedtls_mpi_init((mbedtls_mpi *)&ZZi.p);
      mbedtls_mpi_init((mbedtls_mpi *)local_88);
      i._4_4_ = mbedtls_mpi_copy(X,&(*T)->Z);
      if (i._4_4_ == 0) {
        for (c = (mbedtls_mpi *)0x1; c < T_size; c = (mbedtls_mpi *)((long)&c->s + 1)) {
          i._4_4_ = mbedtls_mpi_mul_mod(grp,X + (long)c,X + (long)((long)&c[-1].p + 7),
                                        &T[(long)c]->Z);
          if (i._4_4_ != 0) goto LAB_00128e07;
        }
        i._4_4_ = mbedtls_mpi_inv_mod((mbedtls_mpi *)&Zi.p,X + (T_size - 1),&grp->P);
        if (i._4_4_ == 0) {
          c = (mbedtls_mpi *)(T_size - 1);
          do {
            if (c == (mbedtls_mpi *)0x0) {
              i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&ZZi.p,(mbedtls_mpi *)&Zi.p);
            }
            else {
              i._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&ZZi.p,(mbedtls_mpi *)&Zi.p,
                                            X + (long)((long)&c[-1].p + 7));
              if (i._4_4_ != 0) break;
              i._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&Zi.p,(mbedtls_mpi *)&Zi.p,
                                            &T[(long)c]->Z);
            }
            if (((((i._4_4_ != 0) ||
                  (i._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_88,(mbedtls_mpi *)&ZZi.p,
                                                 (mbedtls_mpi *)&ZZi.p), i._4_4_ != 0)) ||
                 (i._4_4_ = mbedtls_mpi_mul_mod(grp,&T[(long)c]->X,&T[(long)c]->X,
                                                (mbedtls_mpi *)local_88), i._4_4_ != 0)) ||
                ((i._4_4_ = mbedtls_mpi_mul_mod(grp,&T[(long)c]->Y,&T[(long)c]->Y,
                                                (mbedtls_mpi *)local_88), i._4_4_ != 0 ||
                 (i._4_4_ = mbedtls_mpi_mul_mod(grp,&T[(long)c]->Y,&T[(long)c]->Y,
                                                (mbedtls_mpi *)&ZZi.p), i._4_4_ != 0)))) ||
               ((i._4_4_ = mbedtls_mpi_shrink(&T[(long)c]->X,(grp->P).n), i._4_4_ != 0 ||
                ((i._4_4_ = mbedtls_mpi_shrink(&T[(long)c]->Y,(grp->P).n), i._4_4_ != 0 ||
                 (mbedtls_mpi_free(&T[(long)c]->Z), c == (mbedtls_mpi *)0x0)))))) break;
            c = (mbedtls_mpi *)((long)&c[-1].p + 7);
          } while( true );
        }
      }
LAB_00128e07:
      mbedtls_mpi_free((mbedtls_mpi *)&Zi.p);
      mbedtls_mpi_free((mbedtls_mpi *)&ZZi.p);
      mbedtls_mpi_free((mbedtls_mpi *)local_88);
      for (c = (mbedtls_mpi *)0x0; c < T_size; c = (mbedtls_mpi *)((long)&c->s + 1)) {
        mbedtls_mpi_free(X + (long)c);
      }
      free(X);
      grp_local._4_4_ = i._4_4_;
    }
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_normalize_jac_many( const mbedtls_ecp_group *grp,
                                   mbedtls_ecp_point *T[], size_t T_size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_mpi *c, u, Zi, ZZi;

    if( T_size < 2 )
        return( ecp_normalize_jac( grp, *T ) );

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_normalize_jac_many( grp, T, T_size ) );
#endif

    if( ( c = mbedtls_calloc( T_size, sizeof( mbedtls_mpi ) ) ) == NULL )
        return( MBEDTLS_ERR_ECP_ALLOC_FAILED );

    for( i = 0; i < T_size; i++ )
        mbedtls_mpi_init( &c[i] );

    mbedtls_mpi_init( &u ); mbedtls_mpi_init( &Zi ); mbedtls_mpi_init( &ZZi );

    /*
     * c[i] = Z_0 * ... * Z_i
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &c[0], &T[0]->Z ) );
    for( i = 1; i < T_size; i++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &c[i], &c[i-1], &T[i]->Z ) );
    }

    /*
     * u = 1 / (Z_0 * ... * Z_n) mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &u, &c[T_size-1], &grp->P ) );

    for( i = T_size - 1; ; i-- )
    {
        /*
         * Zi = 1 / Z_i mod p
         * u = 1 / (Z_0 * ... * Z_i) mod P
         */
        if( i == 0 ) {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Zi, &u ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &Zi, &u, &c[i-1]  ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &u,  &u, &T[i]->Z ) );
        }

        /*
         * proceed as in normalize()
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &ZZi,     &Zi,      &Zi  ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T[i]->X, &T[i]->X, &ZZi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T[i]->Y, &T[i]->Y, &ZZi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T[i]->Y, &T[i]->Y, &Zi  ) );

        /*
         * Post-precessing: reclaim some memory by shrinking coordinates
         * - not storing Z (always 1)
         * - shrinking other coordinates, but still keeping the same number of
         *   limbs as P, as otherwise it will too likely be regrown too fast.
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->X, grp->P.n ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->Y, grp->P.n ) );
        mbedtls_mpi_free( &T[i]->Z );

        if( i == 0 )
            break;
    }

cleanup:

    mbedtls_mpi_free( &u ); mbedtls_mpi_free( &Zi ); mbedtls_mpi_free( &ZZi );
    for( i = 0; i < T_size; i++ )
        mbedtls_mpi_free( &c[i] );
    mbedtls_free( c );

    return( ret );
}